

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::addClause(SAT *this,Lit p,Lit q)

{
  bool bVar1;
  Lit LVar2;
  uint uVar3;
  vec<WatchElem> *this_00;
  vec<vec<WatchElem>_> *this_01;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  SAT *in_stack_ffffffffffffff48;
  vec<WatchElem> *in_stack_ffffffffffffff50;
  bool local_99;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff74;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff78;
  Lit in_stack_ffffffffffffff84;
  Reason local_60;
  undefined4 local_58;
  int8_t local_51;
  undefined4 local_50;
  lbool local_49;
  Reason local_48;
  undefined4 local_40;
  int8_t local_39;
  undefined4 local_38;
  lbool local_32;
  int8_t local_31;
  undefined4 local_30;
  lbool local_2a;
  int8_t local_29;
  undefined4 local_28;
  lbool local_22;
  int8_t local_21;
  undefined4 local_20;
  lbool local_1a;
  int8_t local_19;
  lbool local_11 [9];
  undefined4 local_8;
  undefined4 local_4;
  
  local_8 = in_EDX;
  local_4 = in_ESI;
  local_11[0] = value(in_stack_ffffffffffffff48,(Lit)(int)in_stack_ffffffffffffff50);
  local_19 = ::l_True.value;
  bVar1 = lbool::operator==(local_11,::l_True);
  uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff70);
  if (!bVar1) {
    local_20 = local_8;
    local_1a = value(in_stack_ffffffffffffff48,(Lit)(int)in_stack_ffffffffffffff50);
    local_21 = ::l_True.value;
    bVar1 = lbool::operator==(&local_1a,::l_True);
    uVar4 = CONCAT13(bVar1,(int3)uVar4);
  }
  if ((char)((uint)uVar4 >> 0x18) == '\0') {
    local_28 = local_4;
    local_22 = value(in_stack_ffffffffffffff48,(Lit)(int)in_stack_ffffffffffffff50);
    local_29 = ::l_False.value;
    bVar1 = lbool::operator==(&local_22,::l_False);
    local_99 = false;
    if (bVar1) {
      local_30 = local_8;
      local_2a = value(in_stack_ffffffffffffff48,(Lit)(int)in_stack_ffffffffffffff50);
      local_31 = ::l_False.value;
      local_99 = lbool::operator==(&local_2a,::l_False);
    }
    if (local_99 != false) {
      printf("=====UNSATISFIABLE=====\n");
      printf("%% Top level failure!\n");
      exit(0);
    }
    local_38 = local_4;
    local_32 = value(in_stack_ffffffffffffff48,(Lit)(int)in_stack_ffffffffffffff50);
    local_39 = ::l_False.value;
    bVar1 = lbool::operator==(&local_32,::l_False);
    if (bVar1) {
      local_40 = local_8;
      Reason::Reason(&local_48,(Clause *)0x0);
      enqueue((SAT *)CONCAT44(in_stack_ffffffffffffff74,uVar4),in_stack_ffffffffffffff84,
              (Reason)in_stack_ffffffffffffff78);
    }
    else {
      local_50 = local_8;
      local_49 = value(in_stack_ffffffffffffff48,(Lit)(int)in_stack_ffffffffffffff50);
      local_51 = ::l_False.value;
      bVar1 = lbool::operator==(&local_49,::l_False);
      if (bVar1) {
        local_58 = local_4;
        Reason::Reason(&local_60,(Clause *)0x0);
        enqueue((SAT *)CONCAT44(in_stack_ffffffffffffff74,uVar4),in_stack_ffffffffffffff84,
                (Reason)in_stack_ffffffffffffff78);
      }
      else {
        *(int *)(in_RDI + 0x1f0) = *(int *)(in_RDI + 0x1f0) + 1;
        LVar2 = operator~((Lit)0x290dc0);
        uVar3 = toInt(LVar2);
        this_00 = vec<vec<WatchElem>_>::operator[]((vec<vec<WatchElem>_> *)(in_RDI + 0x40),uVar3);
        WatchElem::WatchElem
                  ((WatchElem *)this_00,(Lit)(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        vec<WatchElem>::push(in_stack_ffffffffffffff50,(WatchElem *)this_00);
        this_01 = (vec<vec<WatchElem>_> *)(in_RDI + 0x40);
        LVar2 = operator~((Lit)0x290e28);
        uVar3 = toInt(LVar2);
        vec<vec<WatchElem>_>::operator[](this_01,uVar3);
        WatchElem::WatchElem((WatchElem *)this_00,(Lit)(int)((ulong)this_01 >> 0x20));
        vec<WatchElem>::push((vec<WatchElem> *)this_01,(WatchElem *)this_00);
      }
    }
  }
  return;
}

Assistant:

void SAT::addClause(Lit p, Lit q) {
	if (value(p) == l_True || value(q) == l_True) {
		return;
	}
	if (value(p) == l_False && value(q) == l_False) {
		assert(false);
		TL_FAIL();
	}
	if (value(p) == l_False) {
		assert(decisionLevel() == 0);
		enqueue(q);
		return;
	}
	if (value(q) == l_False) {
		assert(decisionLevel() == 0);
		enqueue(p);
		return;
	}
	bin_clauses++;
	watches[toInt(~p)].push(q);
	watches[toInt(~q)].push(p);
}